

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O2

bool google::protobuf::compiler::csharp::SupportsPresenceApi(FieldDescriptor *descriptor)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  
  if (descriptor->type_ == '\v') {
    return false;
  }
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (((descriptor->type_ & 0xfe) != 10) && ((descriptor->field_0x1 & 8) == 0)) {
      pOVar2 = FieldDescriptor::containing_oneof(descriptor);
      if (pOVar2 == (OneofDescriptor *)0x0) {
        bVar1 = (descriptor->merged_features_->field_0)._impl_.field_presence_ != 2;
      }
    }
  }
  return bVar1;
}

Assistant:

inline bool SupportsPresenceApi(const FieldDescriptor* descriptor) {
  // Unlike most languages, we don't generate Has/Clear members for message
  // types, because they can always be set to null in C#. They're not really
  // needed for oneof fields in proto2 either, as everything can be done via
  // oneof case, but we follow the convention from other languages.
  if (descriptor->type() == FieldDescriptor::TYPE_MESSAGE) {
    return false;
  }

  return descriptor->has_presence();
}